

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

uint32_t assess_splitting_option(aec_stream *strm)

{
  internal_state *piVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  aec_stream *in_RDI;
  bool bVar6;
  internal_state *state;
  uint64_t fs_len;
  uint64_t len_min;
  uint64_t len;
  int dir;
  int no_turn;
  int this_bs;
  int k_min;
  int k;
  ulong local_30;
  int local_10;
  int local_c;
  
  piVar1 = in_RDI->state;
  iVar3 = in_RDI->block_size - piVar1->ref;
  local_30 = 0xffffffffffffffff;
  local_10 = piVar1->k;
  bVar6 = local_10 == 0;
  bVar2 = true;
  local_c = local_10;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar4 = block_fs(in_RDI,local_c);
          uVar5 = uVar4 + (long)(iVar3 * (local_c + 1));
          if (uVar5 < local_30) break;
          if (bVar6) goto LAB_0010252f;
          local_c = piVar1->k + -1;
          bVar2 = false;
          bVar6 = true;
        }
        if (local_30 != 0xffffffffffffffff) {
          bVar6 = true;
        }
        local_10 = local_c;
        local_30 = uVar5;
        if (bVar2) break;
        if (((ulong)(long)iVar3 <= uVar4) || (local_c == 0)) goto LAB_0010252f;
        local_c = local_c + -1;
      }
      if ((uVar4 < (ulong)(long)iVar3) || (piVar1->kmax <= local_c)) break;
      local_c = local_c + 1;
    }
    if (bVar6) break;
    local_c = piVar1->k + -1;
    bVar2 = false;
    bVar6 = true;
  }
LAB_0010252f:
  piVar1->k = local_10;
  return (uint32_t)local_30;
}

Assistant:

static uint32_t assess_splitting_option(struct aec_stream *strm)
{
    /**
       Length of CDS encoded with splitting option and optimal k.

       In Rice coding each sample in a block of samples is split at
       the same position into k LSB and bits_per_sample - k MSB. The
       LSB part is left binary and the MSB part is coded as a
       fundamental sequence a.k.a. unary (see CCSDS 121.0-B-2). The
       function of the length of the Coded Data Set (CDS) depending on
       k has exactly one minimum (see A. Kiely, IPN Progress Report
       42-159).

       To find that minimum with only a few costly evaluations of the
       CDS length, we start with the k of the previous CDS. K is
       increased and the CDS length evaluated. If the CDS length gets
       smaller, then we are moving towards the minimum. If the length
       increases, then the minimum will be found with smaller k.

       For increasing k we know that we will gain block_size bits in
       length through the larger binary part. If the FS lenth is less
       than the block size then a reduced FS part can't compensate the
       larger binary part. So we know that the CDS for k+1 will be
       larger than for k without actually computing the length. An
       analogue check can be done for decreasing k.
     */

    int k;
    int k_min;
    int this_bs; /* Block size of current block */
    int no_turn; /* 1 if we shouldn't reverse */
    int dir; /* Direction, 1 means increasing k, 0 decreasing k */
    uint64_t len; /* CDS length for current k */
    uint64_t len_min; /* CDS length minimum so far */
    uint64_t fs_len; /* Length of FS part (not including 1s) */

    struct internal_state *state = strm->state;

    this_bs = strm->block_size - state->ref;
    len_min = UINT64_MAX;
    k = k_min = state->k;
    no_turn = k == 0;
    dir = 1;

    for (;;) {
        fs_len = block_fs(strm, k);
        len = fs_len + this_bs * (k + 1);

        if (len < len_min) {
            if (len_min < UINT64_MAX)
                no_turn = 1;

            len_min = len;
            k_min = k;

            if (dir) {
                if (fs_len < this_bs || k >= state->kmax) {
                    if (no_turn)
                        break;
                    k = state->k - 1;
                    dir = 0;
                    no_turn = 1;
                } else {
                    k++;
                }
            } else {
                if (fs_len >= this_bs || k == 0)
                    break;
                k--;
            }
        } else {
            if (no_turn)
                break;
            k = state->k - 1;
            dir = 0;
            no_turn = 1;
        }
    }
    state->k = k_min;

    return (uint32_t)len_min;
}